

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjComputeLevelD(Acb_Ntk_t *p,int iObj)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  piVar4 = Acb_ObjFanins(p,iObj);
  lVar6 = 0;
  iVar5 = 0;
  while (lVar6 < *piVar4) {
    lVar1 = lVar6 + 1;
    lVar6 = lVar6 + 1;
    iVar2 = Acb_ObjLevelD(p,piVar4[lVar1]);
    if (iVar5 <= iVar2) {
      iVar5 = iVar2;
    }
  }
  uVar3 = Acb_ObjIsCio(p,iObj);
  iVar5 = (uVar3 ^ 1) + iVar5;
  Vec_IntWriteEntry(&p->vLevelD,iObj,iVar5);
  return iVar5;
}

Assistant:

int Acb_ObjComputeLevelD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Level = 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iFanin) );
    return Acb_ObjSetLevelD( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}